

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O2

trie_node trie_node_find(trie t,trie_key key)

{
  trie_node ptVar1;
  int iVar2;
  vector v;
  size_t sVar3;
  long *plVar4;
  set_value pvVar5;
  set_iterator it;
  trie_node current_node;
  
  v = vector_create(8);
  vector_push_back(v,t);
  do {
    do {
      sVar3 = vector_size(v);
      if (sVar3 == 0) {
        vector_destroy(v);
        return (trie_node)0x0;
      }
      plVar4 = (long *)vector_back(v);
      vector_pop_back(v);
    } while ((plVar4 == (long *)0x0) || (ptVar1 = (trie_node)*plVar4, ptVar1 == (trie_node)0x0));
    it = (set_iterator)0x0;
    if (ptVar1->childs != (set)0x0) {
      it = set_iterator_begin(ptVar1->childs);
      while (iVar2 = set_iterator_end(&it), 0 < iVar2) {
        pvVar5 = set_iterator_get_value(it);
        current_node = t->node_list + *(long *)((long)pvVar5 + 8);
        vector_push_back(v,&current_node);
        set_iterator_next(it);
      }
    }
  } while ((ptVar1->key == (comparable)0x0) ||
          (iVar2 = (*t->compare_cb)(ptVar1->key,key), iVar2 != 0));
  while (iVar2 = set_iterator_end(&it), 0 < iVar2) {
    set_iterator_next(it);
  }
  vector_destroy(v);
  return ptVar1;
}

Assistant:

trie_node trie_node_find(trie t, trie_key key)
{
	if (t != NULL && key != NULL)
	{
		vector node_stack = vector_create(sizeof(trie_node));

		vector_push_back(node_stack, &t->root);

		while (vector_size(node_stack) > 0)
		{
			trie_node *back_ptr = vector_back(node_stack);

			vector_pop_back(node_stack);

			if (back_ptr != NULL && *back_ptr != NULL)
			{
				trie_node back = *back_ptr;

				set_iterator it = NULL;

				if (back->childs != NULL)
				{
					for (it = set_iterator_begin(back->childs); set_iterator_end(&it) > 0; set_iterator_next(it))
					{
						trie_node_ref ref_node = set_iterator_get_value(it);

						trie_node current_node = &t->node_list[ref_node->index];

						vector_push_back(node_stack, &current_node);
					}
				}

				if (back->key != NULL && t->compare_cb(back->key, key) == 0)
				{
					while (set_iterator_end(&it) > 0)
					{
						set_iterator_next(it);
					}

					vector_destroy(node_stack);

					return back;
				}
			}
		}

		vector_destroy(node_stack);
	}

	return NULL;
}